

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

int memory_stream_init(memory_stream *ms,char *fill_pattern)

{
  size_t sVar1;
  void *pvVar2;
  char *fill_pattern_local;
  memory_stream *ms_local;
  
  ms->read_pos = 0;
  sVar1 = strlen(fill_pattern);
  ms->size = sVar1;
  (ms->ios).read_some = read_some;
  (ms->ios).write_some = write_some;
  (ms->ios).close = client_close;
  pvVar2 = malloc(ms->size + 1);
  ms->mem = pvVar2;
  if (ms->mem == (void *)0x0) {
    ms_local._4_4_ = -1;
  }
  else {
    memset(ms->mem,0,ms->size + 1);
    memcpy(ms->mem,fill_pattern,ms->size);
    ms_local._4_4_ = 0;
  }
  return ms_local._4_4_;
}

Assistant:

static int memory_stream_init(struct memory_stream *ms, const char *fill_pattern)
{
	ms->read_pos = 0;
	ms->size = strlen(fill_pattern);
	ms->ios.read_some = read_some;
	ms->ios.write_some = write_some;
	ms->ios.close = client_close;
	ms->mem = malloc(ms->size + 1);
	if (ms->mem == NULL) {
		return -1;
	}
	memset(ms->mem, 0x00, ms->size + 1);
	memcpy(ms->mem, fill_pattern, ms->size);
	return 0;
}